

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

parser_error parse_vault_rows(parser *p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ulong local_28;
  size_t i;
  vault *v;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    uVar1 = parser_getuint(p,"height");
    *(char *)((long)pvVar3 + 0x22) = (char)uVar1;
    local_28 = 0;
    while ((local_28 < 0x13 &&
           (iVar2 = strcmp(*(char **)((long)pvVar3 + 0x18),room_builders[local_28].name), iVar2 != 0
           ))) {
      local_28 = local_28 + 1;
    }
    if (local_28 == 0x13) {
      p_local._4_4_ = PARSE_ERROR_NO_ROOM_FOUND;
    }
    else if (room_builders[local_28].max_height < (int)(uint)*(byte *)((long)pvVar3 + 0x22)) {
      p_local._4_4_ = PARSE_ERROR_VAULT_TOO_BIG;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_vault_rows(struct parser *p) {
	struct vault *v = parser_priv(p);
	size_t i;

	if (!v)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	v->hgt = parser_getuint(p, "height");

	/* Make sure vaults are no higher than the room profiles allow. */
	for (i = 0; i < N_ELEMENTS(room_builders); i++)
		if (streq(v->typ, room_builders[i].name))
			break;
	if (i == N_ELEMENTS(room_builders))
		return PARSE_ERROR_NO_ROOM_FOUND;
	if (v->hgt > room_builders[i].max_height)
		return PARSE_ERROR_VAULT_TOO_BIG;
	return PARSE_ERROR_NONE;
}